

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)1>_>::
~ParticleTest_GetSetVelocity_Test
          (ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  void *in_RDI;
  
  ~ParticleTest_GetSetVelocity_Test
            ((ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)1>_> *)0x201828);
  operator_delete(in_RDI,0x20);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetVelocity)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;

    ParticleType particle = this->randomParticle();
    MomentumType newVelocity(5243.1654, -56.23e5, -65.237e-4);
    particle.setVelocity(newVelocity);
    this->maxRelativeError = 1e-12;
    MomentumType v = particle.getVelocity();
    ASSERT_NEAR_VECTOR(newVelocity, particle.getVelocity());
}